

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  long lVar1;
  uint8_t *input_00;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  code *cb;
  bool bVar7;
  size_t decrypted_length;
  st_ptls_record_t local_50;
  size_t local_38;
  
  iVar2 = parse_record(tls,&local_50,(uint8_t *)input,inlen);
  input_00 = local_50.fragment;
  sVar4 = local_50.length;
  if (iVar2 != 0) {
    return iVar2;
  }
  if (local_50.fragment == (uint8_t *)0x0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x16ed,
                  "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (local_50.type == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if (local_50.length != 1) {
      return 0x2f;
    }
    uVar3 = 0x202;
    if (*local_50.fragment != '\x01') {
      return 0x2f;
    }
    goto LAB_001141f1;
  }
  if ((local_50.type == '\x15') ||
     ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
    if ((local_50.type != '\x17') ||
       (((tls->field_0x1e8 & 1) == 0 ||
        ((tls->field_19).server.early_data_skipped_bytes == 0xffffffff)))) goto LAB_00114100;
  }
  else {
    iVar6 = 1;
    iVar2 = 0x28;
    if (local_50.type != '\x17') goto LAB_001140b0;
    iVar2 = ptls_buffer_reserve_aligned(decryptbuf,local_50.length + 5,'\0');
    if (iVar2 == 0) {
      iVar2 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,
                           &local_38,input_00,sVar4);
      if (iVar2 == 0) {
        local_50.fragment = decryptbuf->base + decryptbuf->off;
        bVar7 = local_38 == 0;
        if (bVar7) {
LAB_00114292:
          iVar2 = 10;
          local_50.length = local_38;
          goto LAB_001140ab;
        }
        if (local_50.fragment[local_38 - 1] == '\0') {
          sVar4 = local_38;
          do {
            bVar7 = sVar4 == 1;
            if (bVar7) {
              local_38 = 0;
              goto LAB_00114292;
            }
            local_38 = sVar4 - 1;
            lVar1 = sVar4 + (decryptbuf->off - 2);
            sVar4 = local_38;
          } while (decryptbuf->base[lVar1] == '\0');
        }
        iVar2 = 10;
        iVar6 = 1;
        local_50.length = local_38;
        if (!bVar7) {
          local_50.length = local_38 - 1;
          local_50.type = local_50.fragment[local_38 - 1];
          iVar2 = (int)CONCAT71((int7)(local_50.length >> 8),local_50.type);
          iVar6 = 0;
        }
      }
      else {
        if (((tls->field_0x1e8 & 1) == 0) ||
           ((tls->field_19).server.early_data_skipped_bytes == 0xffffffff)) goto LAB_001140ab;
        iVar6 = 3;
      }
    }
    else {
LAB_001140ab:
      iVar6 = 1;
    }
LAB_001140b0:
    if (iVar6 == 0) {
LAB_00114100:
      if (local_50.type == '\x16' || (tls->recvbuf).mess.base != (uint8_t *)0x0) {
        cb = handle_server_handshake_message;
        if ((tls->field_0x1e8 & 1) == 0) {
          cb = handle_client_handshake_message;
        }
        uVar3 = handle_handshake_record(tls,cb,emitter,&local_50,properties);
      }
      else if (local_50.type == '\x15') {
        uVar3 = 0x32;
        if (local_50.length == 2) {
          uVar3 = local_50.fragment[1] | 0x100;
        }
      }
      else {
        uVar3 = 10;
        if (local_50.type == '\x17') {
          if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
            if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
              uVar3 = 0;
              if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
                decryptbuf->off = decryptbuf->off + local_50.length;
                uVar3 = 0;
              }
            }
          }
          else {
            decryptbuf->off = decryptbuf->off + local_50.length;
            uVar3 = 0;
          }
        }
      }
      goto LAB_001141f1;
    }
    if (iVar6 != 3) {
      return iVar2;
    }
  }
  uVar5 = (tls->field_19).server.early_data_skipped_bytes + (int)local_50.length;
  (tls->field_19).server.early_data_skipped_bytes = uVar5;
  uVar3 = 0x202;
  if (0x10000 < uVar5) {
    return 0x28;
  }
LAB_001141f1:
  ptls_buffer__release_memory(&(tls->recvbuf).rec);
  (tls->recvbuf).rec.off = 0;
  (tls->recvbuf).rec.is_allocated = '\0';
  (tls->recvbuf).rec.align_bits = '\0';
  *(undefined6 *)&(tls->recvbuf).rec.field_0x1a = 0;
  (tls->recvbuf).rec.base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  return uVar3;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}